

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void test_read_format_zip_7z_deflate(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  archive_entry *ae;
  archive_entry *local_30;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'Ѱ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ѱ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  extract_reference_file("test_read_format_zip_7z_deflate.zip");
  wVar2 = archive_read_support_format_zip((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ѵ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_zip_7z_deflate.zip",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ѷ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  pcVar4 = archive_zlib_version();
  if (pcVar4 == (char *)0x0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ѻ',-0x19,"ARCHIVE_FAILED",(long)iVar1,"r",(void *)0x0);
    pcVar4 = archive_error_string((archive *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ѽ',pcVar4,"archive_error_string(a)",
               "Unsupported ZIP compression method during decompression of link entry (8: deflation)"
               ,
               "\"Unsupported ZIP compression method during decompression \" \"of link entry (8: deflation)\""
               ,(void *)0x0,L'\0');
    iVar1 = archive_errno((archive *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'Ѿ',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ҁ',0,"ARCHIVE_OK",(long)iVar1,"r",a);
    pcVar4 = archive_entry_symlink(local_30);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'҂',"libxkbcommon-x11.so.0.0.0","\"libxkbcommon-x11.so.0.0.0\"",pcVar4,
               "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  mVar3 = archive_entry_filetype(local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'҄',0xa000,"AE_IFLNK",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  pcVar4 = archive_zlib_version();
  if (pcVar4 == (char *)0x0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'҈',-0x19,"ARCHIVE_FAILED",(long)iVar1,"r",(void *)0x0);
    pcVar4 = archive_error_string((archive *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ҋ',pcVar4,"archive_error_string(a)",
               "Unsupported ZIP compression method during decompression of link entry (8: deflation)"
               ,
               "\"Unsupported ZIP compression method during decompression \" \"of link entry (8: deflation)\""
               ,(void *)0x0,L'\0');
    iVar1 = archive_errno((archive *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'Ҍ',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ҏ',0,"ARCHIVE_OK",(long)iVar1,"r",a);
    pcVar4 = archive_entry_symlink(local_30);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'Ґ',"libxkbcommon-x11.so.0.0.0","\"libxkbcommon-x11.so.0.0.0\"",pcVar4,
               "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  mVar3 = archive_entry_filetype(local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ғ',0xa000,"AE_IFLNK",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ғ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ҕ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_7z_deflate)
{
	const char *refname = "test_read_format_zip_7z_deflate.zip";
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	extract_reference_file(refname);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_read_open_filename(a, refname, 10240));
	//read first symlink
	r = archive_read_next_header(a, &ae);
	if (archive_zlib_version() == NULL) {
		assertEqualInt(ARCHIVE_FAILED, r);
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method during decompression "
		    "of link entry (8: deflation)");
		assert(archive_errno(a) != 0);
	} else {
		assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualString("libxkbcommon-x11.so.0.0.0",
			archive_entry_symlink(ae));
	}
	assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
	//read second symlink
	r = archive_read_next_header(a, &ae);
	if (archive_zlib_version() == NULL) {
		assertEqualInt(ARCHIVE_FAILED, r);
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method during decompression "
		    "of link entry (8: deflation)");
		assert(archive_errno(a) != 0);
	} else {
		assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualString("libxkbcommon-x11.so.0.0.0",
			archive_entry_symlink(ae));
	}
	assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}